

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
mjs::do_statement::do_statement
          (do_statement *this,source_extend *extend,expression_ptr *cond,statement_ptr *s)

{
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__do_statement_001c75b8;
  (this->cond_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (cond->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (cond->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
       super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  if ((this->cond_)._M_t.
      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0) {
    __assert_fail("cond_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x280,
                  "mjs::do_statement::do_statement(const source_extend &, expression_ptr &&, statement_ptr &&)"
                 );
  }
  if ((this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl != (statement *)0x0) {
    return;
  }
  __assert_fail("s_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x281,
                "mjs::do_statement::do_statement(const source_extend &, expression_ptr &&, statement_ptr &&)"
               );
}

Assistant:

explicit do_statement(const source_extend& extend, expression_ptr&& cond, statement_ptr&& s) : statement(extend), cond_(std::move(cond)), s_(std::move(s)) {
        assert(cond_);
        assert(s_);
    }